

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

void __thiscall mp::internal::TextReader<fmt::Locale>::TextReader(TextReader<fmt::Locale> *this)

{
  ReaderBase::ReaderBase();
  this->line_start_ = (this->super_ReaderBase).ptr_;
  this->line_ = 1;
  CopyableLocale::CopyableLocale(&this->locale_);
  return;
}

Assistant:

mp::internal::TextReader<Locale>::TextReader(
    NLStringRef data, fmt::CStringRef name)
: ReaderBase(data, name), line_start_(ptr_), line_(1) {}